

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O0

boolean find_misc(monst *mtmp,musable *m)

{
  char cVar1;
  uint uVar2;
  permonst *ptr;
  boolean bVar3;
  int iVar4;
  int y0;
  int iVar5;
  trap *ptVar6;
  obj *poVar7;
  bool bVar8;
  int local_48;
  boolean ignore_boulders;
  boolean stuck;
  int iStack_44;
  boolean immobile;
  int yy;
  int xx;
  trap *t;
  int y;
  int x;
  permonst *mdat;
  obj *obj;
  musable *m_local;
  monst *mtmp_local;
  
  ptr = mtmp->data;
  iVar4 = (int)mtmp->mx;
  y0 = (int)mtmp->my;
  cVar1 = ptr->mmove;
  bVar8 = mtmp != u.ustuck;
  m->misc = (obj *)0x0;
  m->has_misc = MUSE_NONE;
  if (((ptr->mflags1 & 0x40000) == 0) && ((ptr->mflags1 & 0x10000) == 0)) {
    if (((u._1052_1_ & 1) == 0) || (bVar8)) {
      iVar5 = dist2(iVar4,y0,(int)mtmp->mux,(int)mtmp->muy);
      if (iVar5 < 0x25) {
        if ((((bVar8) && (cVar1 != '\0')) && ((*(uint *)&mtmp->field_0x60 >> 4 & 7) == 0)) &&
           (iVar5 = monsndx(ptr), monstr[iVar5] < 6)) {
          bVar8 = true;
          if ((ptr->msize != '\0') && (bVar8 = true, (ptr->mflags2 & 0x8000000) == 0)) {
            bVar8 = (ptr->mflags1 & 8) != 0;
          }
          for (iStack_44 = iVar4 + -1; iStack_44 <= iVar4 + 1; iStack_44 = iStack_44 + 1) {
            for (local_48 = y0 + -1; local_48 <= y0 + 1; local_48 = local_48 + 1) {
              if ((((((0 < iStack_44) && (iStack_44 < 0x50)) &&
                    ((-1 < local_48 && (local_48 < 0x15)))) &&
                   ((iStack_44 != u.ux || (local_48 != u.uy)))) &&
                  ((ptr != mons + 0x78 || ((iStack_44 == iVar4 || (local_48 == y0)))))) &&
                 (((level->monsters[iStack_44][local_48] == (monst *)0x0 &&
                   (ptVar6 = t_at(level,iStack_44,local_48), ptVar6 != (trap *)0x0)) &&
                  ((((bVar8 || (poVar7 = sobj_at(0x214,level,iStack_44,local_48),
                               poVar7 == (obj *)0x0)) &&
                    (bVar3 = onscary(iStack_44,local_48,mtmp), bVar3 == '\0')) &&
                   ((ptVar6->field_0x8 & 0x1f) == 0x17)))))) {
                trapx = iStack_44;
                trapy = local_48;
                m->has_misc = MUSE_POLY_TRAP;
                return '\x01';
              }
            }
          }
        }
        if ((ptr->mflags1 & 0x2000) == 0) {
          for (mdat = (permonst *)mtmp->minvent; mdat != (permonst *)0x0;
              mdat = (permonst *)mdat->mname) {
            if ((mdat->cnutrit == 299) &&
               ((uVar2._0_1_ = mdat[1].mmove, uVar2._1_1_ = mdat[1].ac, uVar2._2_1_ = mdat[1].mr,
                uVar2._3_1_ = mdat[1].maligntyp, (uVar2 & 1) == 0 ||
                ((((*(uint *)&mtmp->field_0x60 >> 0x1b & 1) == 0 &&
                  ((*(uint *)&mtmp->field_0x60 >> 0x19 & 1) == 0)) &&
                 ((*(uint *)&mtmp->field_0x60 >> 0x1c & 1) == 0)))))) {
              m->misc = (obj *)mdat;
              m->has_misc = MUSE_POT_GAIN_LEVEL;
            }
            if (m->has_misc != MUSE_BULLWHIP) {
              if (((mdat->cnutrit == 0x41) && (mtmp->mw == (obj *)mdat)) &&
                 ((iVar4 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar4 == 1 &&
                  ((uwep != (obj *)0x0 && ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0)))))) {
                m->misc = (obj *)mdat;
                m->has_misc = MUSE_BULLWHIP;
              }
              if (m->has_misc != MUSE_WAN_MAKE_INVISIBLE) {
                if (((((mdat->cnutrit == 0x1c5) && ('\0' < (char)mdat->mflags2)) &&
                     ((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0)) &&
                    ((*(uint *)&mtmp->field_0x60 >> 2 & 1) == 0)) &&
                   (((((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0 ||
                      (u.uprops[0xc].intrinsic != 0)) ||
                     ((u.uprops[0xc].extrinsic != 0 || (((youmonst.data)->mflags1 & 0x1000000) != 0)
                      ))) && ((bVar3 = attacktype(mtmp->data,0xf), bVar3 == '\0' ||
                              ((*(uint *)&mtmp->field_0x60 >> 8 & 1) != 0)))))) {
                  m->misc = (obj *)mdat;
                  m->has_misc = MUSE_WAN_MAKE_INVISIBLE;
                }
                if (m->has_misc != MUSE_POT_INVISIBILITY) {
                  if (((((mdat->cnutrit == 0x135) && ((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0))
                       && ((*(uint *)&mtmp->field_0x60 >> 2 & 1) == 0)) &&
                      ((((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0 ||
                        (u.uprops[0xc].intrinsic != 0)) ||
                       ((u.uprops[0xc].extrinsic != 0 ||
                        (((youmonst.data)->mflags1 & 0x1000000) != 0)))))) &&
                     ((bVar3 = attacktype(mtmp->data,0xf), bVar3 == '\0' ||
                      ((*(uint *)&mtmp->field_0x60 >> 8 & 1) != 0)))) {
                    m->misc = (obj *)mdat;
                    m->has_misc = MUSE_POT_INVISIBILITY;
                  }
                  if (m->has_misc != MUSE_WAN_SPEED_MONSTER) {
                    if ((((mdat->cnutrit == 0x1c7) && ('\0' < (char)mdat->mflags2)) &&
                        ((*(uint *)&mtmp->field_0x60 >> 10 & 3) != 2)) &&
                       ((*(uint *)&mtmp->field_0x60 >> 0x1b & 1) == 0)) {
                      m->misc = (obj *)mdat;
                      m->has_misc = MUSE_WAN_SPEED_MONSTER;
                    }
                    if (m->has_misc != MUSE_POT_SPEED) {
                      if (((mdat->cnutrit == 0x12f) && ((*(uint *)&mtmp->field_0x60 >> 10 & 3) != 2)
                          ) && ((*(uint *)&mtmp->field_0x60 >> 0x1b & 1) == 0)) {
                        m->misc = (obj *)mdat;
                        m->has_misc = MUSE_POT_SPEED;
                      }
                      if (m->has_misc != MUSE_WAN_POLYMORPH) {
                        if (((mdat->cnutrit == 0x1c9) && ('\0' < (char)mdat->mflags2)) &&
                           (((*(uint *)&mtmp->field_0x60 >> 4 & 7) == 0 &&
                            (iVar4 = monsndx(ptr), monstr[iVar4] < 6)))) {
                          m->misc = (obj *)mdat;
                          m->has_misc = MUSE_WAN_POLYMORPH;
                        }
                        if ((((m->has_misc != MUSE_POT_POLYMORPH) && (mdat->cnutrit == 0x13a)) &&
                            ((*(uint *)&mtmp->field_0x60 >> 4 & 7) == 0)) &&
                           (iVar4 = monsndx(ptr), monstr[iVar4] < 6)) {
                          m->misc = (obj *)mdat;
                          m->has_misc = MUSE_POT_POLYMORPH;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          mtmp_local._7_1_ = m->has_misc != MUSE_NONE;
        }
        else {
          mtmp_local._7_1_ = false;
        }
      }
      else {
        mtmp_local._7_1_ = false;
      }
    }
    else {
      mtmp_local._7_1_ = false;
    }
  }
  else {
    mtmp_local._7_1_ = false;
  }
  return mtmp_local._7_1_;
}

Assistant:

boolean find_misc(struct monst *mtmp, struct musable *m)
{
	struct obj *obj;
	const struct permonst *mdat = mtmp->data;
	int x = mtmp->mx, y = mtmp->my;
	struct trap *t;
	int xx, yy;
	boolean immobile = (mdat->mmove == 0);
	boolean stuck = (mtmp == u.ustuck);

	m->misc = NULL;
	m->has_misc = 0;
	if (is_animal(mdat) || mindless(mdat))
		return 0;
	if (u.uswallow && stuck) return FALSE;

	/* We arbitrarily limit to times when a player is nearby for the
	 * same reason as Junior Pac-Man doesn't have energizers eaten until
	 * you can see them...
	 */
	if (dist2(x, y, mtmp->mux, mtmp->muy) > 36)
		return FALSE;

	if (!stuck && !immobile && !mtmp->cham && monstr[monsndx(mdat)] < 6) {
	  boolean ignore_boulders = (verysmall(mdat) ||
				     throws_rocks(mdat) ||
				     passes_walls(mdat));
	  for (xx = x-1; xx <= x+1; xx++)
	    for (yy = y-1; yy <= y+1; yy++)
		if (isok(xx,yy) && (xx != u.ux || yy != u.uy))
		    if (mdat != &mons[PM_GRID_BUG] || xx == x || yy == y)
			if (/* (xx==x && yy==y) || */ !level->monsters[xx][yy])
			    if ((t = t_at(level, xx, yy)) != 0 &&
			      (ignore_boulders || !sobj_at(BOULDER, level, xx, yy))
			      && !onscary(xx, yy, mtmp)) {
				if (t->ttyp == POLY_TRAP) {
				    trapx = xx;
				    trapy = yy;
				    m->has_misc = MUSE_POLY_TRAP;
				    return TRUE;
				}
			    }
	}
	if (nohands(mdat))
		return 0;

#define nomore(x) if (m->has_misc==x) continue;
	for (obj=mtmp->minvent; obj; obj=obj->nobj) {
		/* Monsters shouldn't recognize cursed items; this kludge is */
		/* necessary to prevent serious problems though... */
		if (obj->otyp == POT_GAIN_LEVEL && (!obj->cursed ||
			    (!mtmp->isgd && !mtmp->isshk && !mtmp->ispriest))) {
			m->misc = obj;
			m->has_misc = MUSE_POT_GAIN_LEVEL;
		}
		nomore(MUSE_BULLWHIP);
		if (obj->otyp == BULLWHIP && (MON_WEP(mtmp) == obj) &&
		   distu(mtmp->mx,mtmp->my)==1 && uwep && !mtmp->mpeaceful) {
			m->misc = obj;
			m->has_misc = MUSE_BULLWHIP;
		}
		/* Note: peaceful/tame monsters won't make themselves
		 * invisible unless you can see them.  Not really right, but...
		 */
		nomore(MUSE_WAN_MAKE_INVISIBLE);
		if (obj->otyp == WAN_MAKE_INVISIBLE && obj->spe > 0 &&
		    !mtmp->minvis && !mtmp->invis_blkd &&
		    (!mtmp->mpeaceful || See_invisible) &&
		    (!attacktype(mtmp->data, AT_GAZE) || mtmp->mcan)) {
			m->misc = obj;
			m->has_misc = MUSE_WAN_MAKE_INVISIBLE;
		}
		nomore(MUSE_POT_INVISIBILITY);
		if (obj->otyp == POT_INVISIBILITY &&
		    !mtmp->minvis && !mtmp->invis_blkd &&
		    (!mtmp->mpeaceful || See_invisible) &&
		    (!attacktype(mtmp->data, AT_GAZE) || mtmp->mcan)) {
			m->misc = obj;
			m->has_misc = MUSE_POT_INVISIBILITY;
		}
		nomore(MUSE_WAN_SPEED_MONSTER);
		if (obj->otyp == WAN_SPEED_MONSTER && obj->spe > 0
				&& mtmp->mspeed != MFAST && !mtmp->isgd) {
			m->misc = obj;
			m->has_misc = MUSE_WAN_SPEED_MONSTER;
		}
		nomore(MUSE_POT_SPEED);
		if (obj->otyp == POT_SPEED && mtmp->mspeed != MFAST
							&& !mtmp->isgd) {
			m->misc = obj;
			m->has_misc = MUSE_POT_SPEED;
		}
		nomore(MUSE_WAN_POLYMORPH);
		if (obj->otyp == WAN_POLYMORPH && obj->spe > 0 && !mtmp->cham
				&& monstr[monsndx(mdat)] < 6) {
			m->misc = obj;
			m->has_misc = MUSE_WAN_POLYMORPH;
		}
		nomore(MUSE_POT_POLYMORPH);
		if (obj->otyp == POT_POLYMORPH && !mtmp->cham
				&& monstr[monsndx(mdat)] < 6) {
			m->misc = obj;
			m->has_misc = MUSE_POT_POLYMORPH;
		}
	}
	return (boolean)(!!m->has_misc);
#undef nomore
}